

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_mgr.cxx
# Opt level: O2

void __thiscall
nuraft::nuraft_global_mgr::init_raft_server(nuraft_global_mgr *this,raft_server *server)

{
  element_type *peVar1;
  int iVar2;
  string local_30;
  
  peVar1 = (server->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar1 = (server->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_30,"global manager detected, %zu commit workers, %zu append workers",
                 (this->config_).num_commit_threads_,(this->config_).num_append_threads_);
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/global_mgr.cxx"
                 ,"init_raft_server",0xa2,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  return;
}

Assistant:

void nuraft_global_mgr::init_raft_server(raft_server* server) {
    ptr<logger>& l_ = server->l_;
    p_in("global manager detected, %zu commit workers, %zu append workers",
         config_.num_commit_threads_,
         config_.num_append_threads_);
}